

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O0

void ncnn::convolution_transform_kernel_packed_sse
               (Mat *weight_data,Mat *weight_data_tm,int num_input,int num_output,int kernel_w,
               int kernel_h,int elempack,int out_elempack)

{
  int in_ECX;
  int in_EDX;
  long *in_RSI;
  undefined4 *puVar1;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  float *k00;
  int j;
  int i;
  int k;
  int p;
  float *g00;
  int q;
  Mat weight_data_r2;
  int maxk;
  Mat *m_1;
  Mat *m;
  undefined8 in_stack_fffffffffffffcc0;
  size_t in_stack_fffffffffffffcc8;
  undefined8 in_stack_fffffffffffffcd0;
  int iVar2;
  undefined8 in_stack_fffffffffffffcd8;
  Mat *in_stack_fffffffffffffce0;
  undefined4 in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd44;
  int local_298;
  int local_294;
  int local_290;
  int local_28c;
  Allocator *in_stack_fffffffffffffdc0;
  int local_238;
  int in_stack_fffffffffffffdcc;
  int in_stack_fffffffffffffdd0;
  int in_stack_fffffffffffffdd4;
  Mat *in_stack_fffffffffffffdd8;
  int *local_220;
  long local_218;
  long *local_208;
  int local_1fc;
  long local_1e8;
  
  iVar2 = (int)((ulong)in_stack_fffffffffffffcd0 >> 0x20);
  Mat::reshape(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0,
               in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc0);
  Mat::create(in_stack_fffffffffffffce0,(int)((ulong)in_stack_fffffffffffffcd8 >> 0x20),
              (int)in_stack_fffffffffffffcd8,iVar2,in_stack_fffffffffffffcc8,
              (int)((ulong)in_stack_fffffffffffffcc0 >> 0x20),
              (Allocator *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
  for (local_238 = 0; local_238 + in_stack_00000010 + -1 < in_ECX;
      local_238 = in_stack_00000010 + local_238) {
    puVar1 = (undefined4 *)(*in_RSI + in_RSI[8] * (long)(local_238 / in_stack_00000010) * in_RSI[2])
    ;
    for (local_28c = 0; local_28c + in_stack_00000008 + -1 < in_EDX;
        local_28c = in_stack_00000008 + local_28c) {
      for (local_290 = 0; local_290 < in_R8D * in_R9D; local_290 = local_290 + 1) {
        for (local_294 = 0; local_294 < in_stack_00000008; local_294 = local_294 + 1) {
          for (local_298 = 0; local_298 < in_stack_00000010; local_298 = local_298 + 1) {
            *puVar1 = *(undefined4 *)
                       ((long)&in_stack_fffffffffffffdd8->data +
                       (long)local_290 * 4 +
                       (long)local_1fc * (long)(local_28c + local_294) * local_218 +
                       local_1e8 * (local_238 + local_298) * local_218);
            puVar1 = puVar1 + 1;
          }
        }
      }
    }
  }
  if (local_220 != (int *)0x0) {
    LOCK();
    iVar2 = *local_220;
    *local_220 = *local_220 + -1;
    UNLOCK();
    if (iVar2 == 1) {
      if (local_208 == (long *)0x0) {
        if (in_stack_fffffffffffffdd8 != (Mat *)0x0) {
          free(in_stack_fffffffffffffdd8);
        }
      }
      else {
        (**(code **)(*local_208 + 0x18))(local_208,in_stack_fffffffffffffdd8);
      }
    }
  }
  return;
}

Assistant:

static void convolution_transform_kernel_packed_sse(const Mat& weight_data, Mat& weight_data_tm, int num_input, int num_output, int kernel_w, int kernel_h, int elempack, int out_elempack)
{
    const int maxk = kernel_w * kernel_h;

    // src = kw-kh-inch-outch
    // dst = pb-pa-kw-kh-inch/pa-outch/pb
    {
        Mat weight_data_r2 = weight_data.reshape(maxk, num_input, num_output);

        weight_data_tm.create(maxk, num_input / elempack, num_output / out_elempack, (size_t)4u * elempack * out_elempack, elempack * out_elempack);

        for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
        {
            float* g00 = weight_data_tm.channel(q / out_elempack);

            for (int p = 0; p + (elempack - 1) < num_input; p += elempack)
            {
                for (int k = 0; k < maxk; k++)
                {
                    for (int i = 0; i < elempack; i++)
                    {
                        for (int j = 0; j < out_elempack; j++)
                        {
                            const float* k00 = weight_data_r2.channel(q + j).row(p + i);

                            g00[0] = k00[k];

                            g00++;
                        }
                    }
                }
            }
        }
    }
}